

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.hpp
# Opt level: O3

void __thiscall
common_server_client_setup::common_server_client_setup
          (common_server_client_setup *this,bool initialize)

{
  common_server_client_setup *ctx;
  
  zmq::context_t::context_t(&this->context);
  zmq::socket_t::socket_t(&this->server,&this->context,0);
  ctx = this;
  zmq::socket_t::socket_t(&this->client,&this->context,0);
  (this->endpoint)._M_dataplus._M_p = (pointer)&(this->endpoint).field_2;
  (this->endpoint)._M_string_length = 0;
  (this->endpoint).field_2._M_local_buf[0] = '\0';
  if (initialize) {
    init(this,(EVP_PKEY_CTX *)ctx);
  }
  return;
}

Assistant:

common_server_client_setup(bool initialize = true)
    {
        if (initialize)
            init();
    }